

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O2

bool __thiscall TCLAP::Arg::_hasBlanks(Arg *this,string *s)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 1;
  do {
    uVar2 = uVar1;
    if (s->_M_string_length <= uVar2) break;
    uVar1 = uVar2 + 1;
  } while ((s->_M_dataplus)._M_p[uVar2] != '\a');
  return uVar2 < s->_M_string_length;
}

Assistant:

inline bool Arg::_hasBlanks( const std::string& s ) const
{
	for ( int i = 1; static_cast<unsigned int>(i) < s.length(); i++ )
		if ( s[i] == Arg::blankChar() )
			return true;

	return false;
}